

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderCommonFunctionTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::AbsCase::getInputValues(AbsCase *this,int numValues,void **values)

{
  DataType dataType;
  pointer pSVar1;
  void *dst;
  deUint32 dVar2;
  int iVar3;
  int in_R9D;
  ulong uVar4;
  Random rnd;
  deRandom dStack_68;
  int local_58 [8];
  float local_38 [6];
  
  local_38[0] = -2.0;
  local_38[1] = 2.0;
  local_38[2] = -1000.0;
  local_38[3] = 1000.0;
  local_38[4] = -1e+07;
  local_38[5] = 1e+07;
  local_58[0] = -0x7f;
  local_58[1] = 0x7f;
  local_58[2] = -0x7fff;
  local_58[3] = 0x7fff;
  local_58[4] = -0x7fffffff;
  local_58[5] = 0x7fffffff;
  dVar2 = deStringHash((this->super_CommonFunctionCase).super_TestCase.super_TestCase.super_TestNode
                       .m_name._M_dataplus._M_p);
  deRandom_init(&dStack_68,dVar2 ^ 0x235fac);
  pSVar1 = (this->super_CommonFunctionCase).m_spec.inputs.
           super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_start;
  dataType = (pSVar1->varType).m_data.basic.type;
  uVar4 = (ulong)(pSVar1->varType).m_data.basic.precision;
  iVar3 = glu::getDataTypeScalarSize(dataType);
  dst = *values;
  if (dataType - TYPE_FLOAT < 4) {
    fillRandomScalars<float>
              ((Random *)&dStack_68,local_38[uVar4 * 2],local_38[uVar4 * 2 + 1],dst,
               iVar3 * numValues,(int)dst);
  }
  else {
    fillRandomScalars<int>
              ((Random *)&dStack_68,local_58[uVar4 * 2],local_58[uVar4 * 2 + 1],dst,
               iVar3 * numValues,in_R9D);
  }
  return;
}

Assistant:

void getInputValues (int numValues, void* const* values) const
	{
		const Vec2 floatRanges[] =
		{
			Vec2(-2.0f,		2.0f),	// lowp
			Vec2(-1e3f,		1e3f),	// mediump
			Vec2(-1e7f,		1e7f)	// highp
		};
		const IVec2 intRanges[] =
		{
			IVec2(-(1<<7)+1,	(1<<7)-1),
			IVec2(-(1<<15)+1,	(1<<15)-1),
			IVec2(0x80000001,	0x7fffffff)
		};

		de::Random				rnd			(deStringHash(getName()) ^ 0x235facu);
		const glu::DataType		type		= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision	= m_spec.inputs[0].varType.getPrecision();
		const int				scalarSize	= glu::getDataTypeScalarSize(type);

		if (glu::isDataTypeFloatOrVec(type))
			fillRandomScalars(rnd, floatRanges[precision].x(), floatRanges[precision].y(), values[0], numValues*scalarSize);
		else
			fillRandomScalars(rnd, intRanges[precision].x(), intRanges[precision].y(), values[0], numValues*scalarSize);
	}